

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O0

void secp256k1_fe_sqr(secp256k1_fe *r,secp256k1_fe *a)

{
  secp256k1_fe *in_RSI;
  long in_RDI;
  secp256k1_fe *in_stack_ffffffffffffffe8;
  
  secp256k1_fe_verify(in_RSI);
  if (8 < in_RSI->magnitude) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
            ,0x156,"test condition failed: a->magnitude <= 8");
    abort();
  }
  secp256k1_fe_impl_sqr(in_RSI,in_stack_ffffffffffffffe8);
  *(undefined4 *)(in_RDI + 0x28) = 1;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  secp256k1_fe_verify(in_RSI);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_sqr(secp256k1_fe *r, const secp256k1_fe *a) {
    secp256k1_fe_verify(a);
    VERIFY_CHECK(a->magnitude <= 8);
    secp256k1_fe_impl_sqr(r, a);
    r->magnitude = 1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
}